

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

void vkt::shaderexecutor::anon_unknown_0::BufferIoExecutor::declareBufferBlocks
               (ostream *src,ShaderSpec *spec)

{
  ostream *poVar1;
  pointer pSVar2;
  DeclareStructTypePtr local_68;
  StructType inputStruct;
  
  if ((spec->inputs).
      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (spec->inputs).
      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    glu::StructType::StructType(&inputStruct,"Inputs");
    for (pSVar2 = (spec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pSVar2 != (spec->inputs).
                  super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
      glu::StructType::addMember(&inputStruct,(pSVar2->name)._M_dataplus._M_p,&pSVar2->varType);
    }
    local_68.indentLevel = 0;
    local_68.structPtr = &inputStruct;
    poVar1 = glu::decl::operator<<(src,&local_68);
    std::operator<<(poVar1,";\n");
    glu::StructType::~StructType(&inputStruct);
  }
  glu::StructType::StructType(&inputStruct,"Outputs");
  for (pSVar2 = (spec->outputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar2 != (spec->outputs).
                super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    glu::StructType::addMember(&inputStruct,(pSVar2->name)._M_dataplus._M_p,&pSVar2->varType);
  }
  local_68.indentLevel = 0;
  local_68.structPtr = &inputStruct;
  poVar1 = glu::decl::operator<<(src,&local_68);
  std::operator<<(poVar1,";\n");
  glu::StructType::~StructType(&inputStruct);
  std::operator<<(src,"\n");
  if ((spec->inputs).
      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (spec->inputs).
      super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<(src,"layout(set = 0, binding = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    poVar1 = std::operator<<(poVar1,", std430) buffer InBuffer\n");
    poVar1 = std::operator<<(poVar1,"{\n");
    poVar1 = std::operator<<(poVar1,"\tInputs inputs[];\n");
    std::operator<<(poVar1,"};\n");
  }
  poVar1 = std::operator<<(src,"layout(set = 0, binding = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  poVar1 = std::operator<<(poVar1,", std430) buffer OutBuffer\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\tOutputs outputs[];\n");
  poVar1 = std::operator<<(poVar1,"};\n");
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void BufferIoExecutor::declareBufferBlocks (std::ostream& src, const ShaderSpec& spec)
{
	// Input struct
	if (!spec.inputs.empty())
	{
		glu::StructType inputStruct("Inputs");
		for (vector<Symbol>::const_iterator symIter = spec.inputs.begin(); symIter != spec.inputs.end(); ++symIter)
			inputStruct.addMember(symIter->name.c_str(), symIter->varType);
		src << glu::declare(&inputStruct) << ";\n";
	}

	// Output struct
	{
		glu::StructType outputStruct("Outputs");
		for (vector<Symbol>::const_iterator symIter = spec.outputs.begin(); symIter != spec.outputs.end(); ++symIter)
			outputStruct.addMember(symIter->name.c_str(), symIter->varType);
		src << glu::declare(&outputStruct) << ";\n";
	}

	src << "\n";

	if (!spec.inputs.empty())
	{
		src	<< "layout(set = 0, binding = " << int(INPUT_BUFFER_BINDING) << ", std430) buffer InBuffer\n"
			<< "{\n"
			<< "	Inputs inputs[];\n"
			<< "};\n";
	}

	src	<< "layout(set = 0, binding = " << int(OUTPUT_BUFFER_BINDING) << ", std430) buffer OutBuffer\n"
		<< "{\n"
		<< "	Outputs outputs[];\n"
		<< "};\n"
		<< "\n";
}